

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::DepsBuildEngineTest_BogusConcurrentDepScan_Test::TestBody()::DynamicTask::
inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  undefined4 uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  ValueType local_40;
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  uVar1 = *(undefined4 *)((long)this + 8);
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 4;
  *local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = (uchar)uVar1;
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (uchar)((uint)uVar1 >> 8);
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (uchar)((uint)uVar1 >> 0x10);
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (uchar)((uint)uVar1 >> 0x18);
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  llbuild::core::TaskInterface::complete(&local_28,&local_40,false);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      ti.complete(intToValue(result));
    }